

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::~IfcLightSourcePositional
          (IfcLightSourcePositional *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8198a0;
  *(undefined8 *)&this->field_0xb8 = 0x819918;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8198c8;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8198f0;
  puVar2 = *(undefined1 **)
            &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.field_0x30;
  puVar1 = &(this->super_IfcLightSource).field_0x40;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0xd0);
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}